

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O2

bool __thiscall ON_BrepRegionTopology::Transform(ON_BrepRegionTopology *this,ON_Xform *xform)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ON_BrepRegion *pOVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ON_BoundingBox local_60;
  
  uVar1 = (this->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.super_ON_ClassArray<ON_BrepFaceSide>.
          m_count;
  uVar2 = (this->m_R).super_ON_ObjectArray<ON_BrepRegion>.super_ON_ClassArray<ON_BrepRegion>.m_count
  ;
  if (this->m_brep != (ON_Brep *)0x0) {
    iVar3 = (this->m_brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
            m_count;
    uVar8 = 0;
    uVar7 = 0;
    if (0 < (int)uVar2) {
      uVar7 = (ulong)uVar2;
    }
    for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
      pOVar6 = (this->m_R).super_ON_ObjectArray<ON_BrepRegion>.super_ON_ClassArray<ON_BrepRegion>.
               m_a;
      ON_BoundingBox::Destroy(&pOVar6[uVar8].m_bbox);
      for (lVar9 = 0; lVar9 < pOVar6[uVar8].m_fsi.m_count; lVar9 = lVar9 + 1) {
        uVar4 = pOVar6[uVar8].m_fsi.m_a[lVar9];
        if ((int)uVar4 < (int)uVar1 && -1 < (int)uVar4) {
          iVar5 = (this->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.
                  super_ON_ClassArray<ON_BrepFaceSide>.m_a[uVar4].m_fi;
          if ((-1 < (long)iVar5) && (iVar5 < iVar3)) {
            ON_Geometry::BoundingBox
                      (&local_60,
                       (ON_Geometry *)
                       ((this->m_brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                        super_ON_ClassArray<ON_BrepFace>.m_a + iVar5));
            ON_BoundingBox::Union(&pOVar6[uVar8].m_bbox,&local_60);
          }
        }
      }
    }
  }
  uVar8 = 0;
  uVar7 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar7 = uVar8;
  }
  for (; uVar7 * 0x30 - uVar8 != 0; uVar8 = uVar8 + 0x30) {
    ON_Object::TransformUserData
              ((ON_Object *)
               ((long)&(((this->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.
                         super_ON_ClassArray<ON_BrepFaceSide>.m_a)->super_ON_Object)._vptr_ON_Object
               + uVar8),xform);
  }
  uVar8 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar8;
  }
  for (; uVar7 * 0x78 - uVar8 != 0; uVar8 = uVar8 + 0x78) {
    ON_Object::TransformUserData
              ((ON_Object *)
               ((long)&(((this->m_R).super_ON_ObjectArray<ON_BrepRegion>.
                         super_ON_ClassArray<ON_BrepRegion>.m_a)->super_ON_Object)._vptr_ON_Object +
               uVar8),xform);
  }
  return true;
}

Assistant:

bool ON_BrepRegionTopology::Transform( const ON_Xform& xform)
{
  // Transforming the bbox makes it grow too large under repeated
  // rotations.  So, we will destroy it here and reset it below.
  //m_bbox.Transform(xform);
  int i, j;
  const int region_count = m_R.Count();
  const int faceside_count = m_FS.Count();
  if ( nullptr != m_brep )
  {
    const int face_count = m_brep->m_F.Count();
    for (i = 0; i < region_count; i++ )
    {
      ON_BrepRegion& r = m_R[i];
      r.m_bbox.Destroy();
      for ( j = 0; j < r.m_fsi.Count(); j++ )
      {
        int fsi = r.m_fsi[j];
        if ( fsi >= 0 && fsi < faceside_count )
        {
          int fi = m_FS[fsi].m_fi;
          if ( fi >= 0 && fi < face_count )
          {
            r.m_bbox.Union(m_brep->m_F[fi].BoundingBox());
          }
        }
      }
    }
  }

  for ( i = 0; i < faceside_count; i++ )
    m_FS[i].TransformUserData(xform);
  for ( i = 0; i < region_count; i++ )
    m_R[i].TransformUserData(xform);

  return true;
}